

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pad-reflect-1d.cpp
# Opt level: O3

void check_tensor(ggml_tensor *t,float *expected_t_d,int ne0,int ne1,int ne2)

{
  float fVar1;
  float fVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  ulong local_60;
  
  if (t->type != GGML_TYPE_F32) goto LAB_00101895;
  lVar3 = t->ne[0];
  if (lVar3 == ne0) {
    if (t->ne[1] == (long)ne1) {
      if (t->ne[2] == (long)ne2) {
        if (0 < ne2) {
          iVar4 = 0;
          local_60 = 0;
          do {
            if (0 < ne1) {
              lVar9 = (long)iVar4 << 2;
              uVar7 = 0;
              do {
                if (0 < ne0) {
                  uVar10 = 0;
                  do {
                    fVar1 = *(float *)((long)expected_t_d + uVar10 * 4 + lVar9);
                    lVar5 = ggml_get_data_f32(t);
                    fVar2 = *(float *)(lVar5 + lVar9 + uVar10 * 4);
                    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
                      printf("expected %.1f, got %.1f at (%d,%d,%d)\n",(double)fVar1,(double)fVar2,
                             uVar10 & 0xffffffff,uVar7 & 0xffffffff,local_60);
                    }
                    if ((fVar1 != fVar2) || (NAN(fVar1) || NAN(fVar2))) {
                      pcVar6 = "expected == actual";
                      uVar8 = 0x30;
                      goto LAB_0010188e;
                    }
                    uVar10 = uVar10 + 1;
                  } while ((uint)ne0 != uVar10);
                }
                uVar7 = uVar7 + 1;
                lVar9 = lVar9 + lVar3 * 4;
              } while (uVar7 != (uint)ne1);
            }
            local_60 = local_60 + 1;
            iVar4 = iVar4 + ne1 * ne0;
          } while (local_60 != (uint)ne2);
        }
        return;
      }
      pcVar6 = "t->ne[2] == ne2";
      uVar8 = 0x27;
    }
    else {
      pcVar6 = "t->ne[1] == ne1";
      uVar8 = 0x26;
    }
  }
  else {
    pcVar6 = "t->ne[0] == ne0";
    uVar8 = 0x25;
  }
LAB_0010188e:
  do {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-pad-reflect-1d.cpp"
               ,uVar8,"GGML_ASSERT(%s) failed",pcVar6);
LAB_00101895:
    pcVar6 = "t->type == GGML_TYPE_F32";
    uVar8 = 0x24;
  } while( true );
}

Assistant:

void check_tensor(struct ggml_tensor * t, float * expected_t_d, int ne0, int ne1, int ne2) {
    GGML_ASSERT(t->type == GGML_TYPE_F32);
    GGML_ASSERT(t->ne[0] == ne0);
    GGML_ASSERT(t->ne[1] == ne1);
    GGML_ASSERT(t->ne[2] == ne2);
    for (int i2 = 0; i2 < ne2; ++i2) {
        for (int i1 = 0; i1 < ne1; ++i1) {
            for (int i0 = 0; i0 < ne0; ++i0) {
                float expected = *(expected_t_d + i2 * ne1 * ne0 + i1 * ne0 + i0);
                float actual = ggml_get_data_f32(t)[i2 * ne1 * ne0 + i1 * ne0 + i0];
                if (expected != actual) {
                    printf("expected %.1f, got %.1f at (%d,%d,%d)\n", expected, actual, i0, i1, i2);
                }
                GGML_ASSERT(expected == actual);
            }
        }
    }
}